

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

void __thiscall
node::anon_unknown_2::NotificationsHandlerImpl::disconnect(NotificationsHandlerImpl *this)

{
  element_type *peVar1;
  ValidationSignals *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  long in_FS_OFFSET;
  shared_ptr<CValidationInterface> callbacks;
  element_type local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (this->m_proxy).
           super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    this_00 = this->m_signals;
    local_18 = (this->m_proxy).
               super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi;
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        local_18->_M_use_count = local_18->_M_use_count + 1;
        UNLOCK();
      }
      else {
        local_18->_M_use_count = local_18->_M_use_count + 1;
      }
    }
    callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = in_RDX._M_pi;
    callbacks.super___shared_ptr<CValidationInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         &local_20;
    local_20._vptr_CValidationInterface = (_func_int **)peVar1;
    ValidationSignals::UnregisterSharedValidationInterface(this_00,callbacks);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    this_01 = (this->m_proxy).
              super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount._M_pi;
    (this->m_proxy).
    super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>.
    _M_ptr = (element_type *)0x0;
    (this->m_proxy).
    super___shared_ptr<node::(anonymous_namespace)::NotificationsProxy,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    if (this_01 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_01);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void disconnect() override
    {
        if (m_proxy) {
            m_signals.UnregisterSharedValidationInterface(m_proxy);
            m_proxy.reset();
        }
    }